

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomCone *geom,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *pTVar3;
  Axis *pAVar4;
  uint32_t indent_00;
  string *psVar5;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t uVar6;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t n_02;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318 [8];
  string axis;
  string local_2f0;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  GeomCone *pGStack_18;
  uint32_t indent_local;
  GeomCone *geom_local;
  
  local_1c = (uint)geom;
  local_1d = (byte)indent & 1;
  psVar5 = __return_storage_ptr__;
  pGStack_18 = (GeomCone *)this;
  geom_local = (GeomCone *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar5;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)(pGStack_18->super_GPrim).spec,s);
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2," Cone \"");
  poVar2 = std::operator<<(poVar2,(string *)&(pGStack_18->super_GPrim).name);
  std::operator<<(poVar2,"\"\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored(&(pGStack_18->super_GPrim).meta);
  uVar6 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_208);
    std::operator<<(poVar2,"(\n");
    std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)&(pGStack_18->super_GPrim).meta,
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    std::operator<<(aoStack_198,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_248);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string((string *)&local_248);
    uVar6 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,uVar6);
  poVar2 = std::operator<<(aoStack_198,(string *)&local_268);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&local_268);
  pTVar3 = &pGStack_18->radius;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"radius",&local_2a9);
  print_typed_attr<double>(&local_288,pTVar3,&local_2a8,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  pTVar3 = &pGStack_18->height;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f0,"height",(allocator *)(axis.field_2._M_local_buf + 0xf));
  print_typed_attr<double>(&local_2d0,pTVar3,&local_2f0,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)(axis.field_2._M_local_buf + 0xf));
  bVar1 = TypedAttributeWithFallback<tinyusdz::Axis>::authored(&pGStack_18->axis);
  if (bVar1) {
    std::__cxx11::string::string(local_318);
    pAVar4 = TypedAttributeWithFallback<tinyusdz::Axis>::get_value(&pGStack_18->axis);
    if (*pAVar4 == X) {
      std::__cxx11::string::operator=(local_318,"\"X\"");
      uVar6 = extraout_EDX_00;
    }
    else {
      pAVar4 = TypedAttributeWithFallback<tinyusdz::Axis>::get_value(&pGStack_18->axis);
      if (*pAVar4 == Y) {
        std::__cxx11::string::operator=(local_318,"\"Y\"");
        uVar6 = extraout_EDX_01;
      }
      else {
        std::__cxx11::string::operator=(local_318,"\"Z\"");
        uVar6 = extraout_EDX_02;
      }
    }
    pprint::Indent_abi_cxx11_(&local_338,(pprint *)(ulong)(local_1c + 1),uVar6);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_338);
    poVar2 = std::operator<<(poVar2,"uniform token axis = ");
    poVar2 = std::operator<<(poVar2,local_318);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string(local_318);
  }
  print_gprim_predefined<tinyusdz::GeomCone>(&local_358,pGStack_18,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  print_props(&local_378,&(pGStack_18->super_GPrim).props,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_398,(pprint *)(ulong)local_1c,n_02);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_398);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_398);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomCone &geom, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(geom.spec) << " Cone \""
     << geom.name << "\"\n";
  if (geom.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(geom.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(geom.radius, "radius", indent + 1);
  ss << print_typed_attr(geom.height, "height", indent + 1);

  if (geom.axis.authored()) {
    std::string axis;
    if (geom.axis.get_value() == Axis::X) {
      axis = "\"X\"";
    } else if (geom.axis.get_value() == Axis::Y) {
      axis = "\"Y\"";
    } else {
      axis = "\"Z\"";
    }
    ss << pprint::Indent(indent + 1) << "uniform token axis = " << axis << "\n";
  }

  ss << print_gprim_predefined(geom, indent + 1);
  ss << print_props(geom.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}